

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_standard_fs_interface(void)

{
  long *plVar1;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar1 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
  }
  if (*plVar1 != 0) {
    *(ALLEGRO_FS_INTERFACE **)(*plVar1 + 0x118) = &_al_fs_interface_stdio;
  }
  return;
}

Assistant:

void al_set_standard_fs_interface(void)
{
   al_set_fs_interface(&_al_fs_interface_stdio);
}